

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_test_utils.h
# Opt level: O3

double lf::assemble::test::multVecAssMat<double,lf::assemble::test::MVMultAssembler>
                 (dim_t codim,DofHandler *dofh,MVMultAssembler *entity_matrix_provider,
                 Matrix<double,__1,_1,_0,__1,_1> *vec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Entity *cell;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined4 extraout_var;
  elem_mat_t *__src;
  Scalar *pSVar8;
  ostream *poVar9;
  string *this;
  ulong index;
  ReturnType RVar10;
  undefined1 auVar11 [16];
  Matrix<double,__1,_1,_0,__1,_1> locvec;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  elem_mat_t elem_mat;
  stringstream ss;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  double local_288;
  Entity *local_280;
  DofHandler *local_278;
  long *local_270;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_268;
  undefined8 *local_260;
  MVMultAssembler *local_258;
  undefined8 *local_250;
  undefined1 local_248 [128];
  ulong local_1c8;
  ulong local_1c0;
  Product<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_1b8;
  ostream local_1a8 [376];
  
  this = &local_2e8;
  local_258 = entity_matrix_provider;
  uVar5 = (*dofh->_vptr_DofHandler[2])(dofh);
  local_278 = dofh;
  if ((vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)uVar5) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"NoDof mismatch ",0xf);
    (*local_278->_vptr_DofHandler[2])();
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," <-> ",5);
    std::ostream::_M_insert<long>((long)poVar9);
    pcVar3 = local_248 + 0x10;
    local_248._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"dofh.NumDofs() == vec.size()","");
    paVar1 = &local_2e8.field_2;
    local_2e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_248,&local_2e8,0x19b,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_248._0_8_ != pcVar3) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    local_248._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"false","");
    local_2e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
               ,"");
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
    base::AssertionFailed((string *)local_248,&local_2e8,0x19b,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    this = (string *)local_248;
LAB_001bab03:
    std::__cxx11::string::~string((string *)this);
    abort();
  }
  (*dofh->_vptr_DofHandler[8])(&local_270,dofh);
  auVar11 = (**(code **)(*local_270 + 0x10))(local_270,codim);
  puVar7 = auVar11._0_8_;
  if (auVar11._8_8_ == 0) {
    local_288 = 0.0;
  }
  else {
    local_260 = puVar7 + auVar11._8_8_;
    local_288 = 0.0;
    do {
      cell = (Entity *)*puVar7;
      local_250 = puVar7;
      uVar5 = (*dofh->_vptr_DofHandler[3])(dofh,cell);
      iVar6 = (*dofh->_vptr_DofHandler[5])(dofh,cell);
      __src = MVMultAssembler::Eval(local_258,cell);
      local_1c8 = (__src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>).m_storage.
                  m_rows;
      local_1c0 = (__src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_>).m_storage.
                  m_cols;
      local_280 = cell;
      if (local_1c0 * local_1c8 != 0) {
        memcpy(local_248,__src,local_1c0 * local_1c8 * 8);
      }
      uVar4 = local_1c8;
      if (local_1c8 != uVar5) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"nrows mismatch ",0xf);
        poVar9 = std::ostream::_M_insert<long>((long)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," <-> ",5);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", entity ",9);
        (**(code **)(*local_270 + 0x28))(local_270,local_280);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        paVar1 = &local_2e8.field_2;
        local_2e8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e8,"elem_mat.rows() == elmat_dim","");
        paVar2 = &local_2c8.field_2;
        local_2c8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_2e8,&local_2c8,0x1ad,&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        local_2e8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"false","");
        local_2c8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,"");
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        base::AssertionFailed(&local_2e8,&local_2c8,0x1ad,&local_2a8);
LAB_001baaec:
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        goto LAB_001bab03;
      }
      if (local_1c0 != local_1c8) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ncols mismatch ",0xf);
        poVar9 = std::ostream::_M_insert<long>((long)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," <-> ",5);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", entity ",9);
        (**(code **)(*local_270 + 0x28))(local_270,local_280);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        paVar1 = &local_2e8.field_2;
        local_2e8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e8,"elem_mat.cols() == elmat_dim","");
        paVar2 = &local_2c8.field_2;
        local_2c8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_2e8,&local_2c8,0x1b0,&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        local_2e8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"false","");
        local_2c8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/assembly_test_utils.h"
                   ,"");
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        base::AssertionFailed(&local_2e8,&local_2c8,0x1b0,&local_2a8);
        goto LAB_001baaec;
      }
      local_2e8._M_dataplus._M_p = (pointer)0x0;
      local_2e8._M_string_length = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_2e8,local_1c8);
      if (uVar5 != 0) {
        index = 0;
        do {
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)vec,
                              *(Index *)(CONCAT44(extraout_var,iVar6) + index * 8));
          local_280 = (Entity *)*pSVar8;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &local_2e8,index);
          *pSVar8 = (Scalar)local_280;
          index = index + 1;
        } while (uVar4 != index);
      }
      Eigen::
      Product<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
      Product(&local_1b8,(Lhs *)local_248,(Rhs *)&local_2e8);
      local_2c8._M_dataplus._M_p = (pointer)local_1b8.m_lhs;
      local_2c8._M_string_length = (size_type)local_1b8.m_rhs;
      RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
               dot<Eigen::Product<Eigen::Matrix<double,_1,_1,1,4,4>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                         ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2e8,
                          (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                           *)&local_2c8);
      local_288 = local_288 + RVar10;
      free(local_2e8._M_dataplus._M_p);
      puVar7 = local_250 + 1;
      dofh = local_278;
    } while (puVar7 != local_260);
  }
  if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268);
  }
  return local_288;
}

Assistant:

SCALAR multVecAssMat(lf::assemble::dim_t codim,
                     const lf::assemble::DofHandler &dofh,
                     ENTITY_MATRIX_PROVIDER &entity_matrix_provider,
                     Eigen::Matrix<SCALAR, Eigen::Dynamic, 1> &vec) {
  LF_ASSERT_MSG(dofh.NumDofs() == vec.size(),
                "NoDof mismatch " << dofh.NumDofs() << " <-> " << vec.size());
  // Pointer to underlying mesh
  auto mesh = dofh.Mesh();
  // Summation variable
  SCALAR s{};
  // Loop over entities of co-dimension codim
  for (const lf::mesh::Entity *const entity : mesh->Entities(codim)) {
    // Some entities may be skipped
    if (entity_matrix_provider.isActive(*entity)) {
      // Size, aka number of rows and columns, of element matrix
      const lf::assemble::size_type elmat_dim = dofh.NumLocalDofs(*entity);
      // Global indices of local shape functions
      std::span<const gdof_idx_t> global_idx(dofh.GlobalDofIndices(*entity));
      // Request local matrix from entity_matrix_provider object. In the case
      // codim = 0, when `entity` is a cell, this is the element matrix
      const auto elem_mat{entity_matrix_provider.Eval(*entity)};
      LF_ASSERT_MSG(elem_mat.rows() == elmat_dim,
                    "nrows mismatch " << elem_mat.rows() << " <-> " << elmat_dim
                                      << ", entity " << mesh->Index(*entity));
      LF_ASSERT_MSG(elem_mat.cols() == elmat_dim,
                    "ncols mismatch " << elem_mat.cols() << " <-> " << elmat_dim
                                      << ", entity " << mesh->Index(*entity));
      Eigen::Matrix<SCALAR, Eigen::Dynamic, 1> locvec(elmat_dim);
      for (int l = 0; l < elmat_dim; ++l) {
        locvec[l] = vec[global_idx[l]];
      }
      s += locvec.dot(elem_mat * locvec);
    }
  }
  return s;
}